

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall
notch::io::PlainTextNetworkReader::read_tag_value<std::__cxx11::string>
          (PlainTextNetworkReader *this,istream *in,string *tag,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string inTag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  read_tag_abi_cxx11_(&inTag,this,in);
  bVar1 = std::operator!=(&inTag,tag);
  if (!bVar1) {
    read_value<std::__cxx11::string>(&local_50,this,in,val);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&inTag);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0,"tag \'",tag);
  std::operator+(&local_90,&local_b0,"\' not found");
  std::runtime_error::runtime_error(this_00,(string *)&local_90);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read_tag_value(std::istream &in, std::string const &tag, VALUE &val) {
        std::string inTag = read_tag(in);
        if (inTag != tag) {
            throw std::runtime_error("tag '" + tag + "' not found");
        }
        read_value<VALUE>(in, val);
    }